

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acesup.c
# Opt level: O0

Card ** acesup_deckCreateWin(unsigned_long *cardsCount)

{
  char *__ptr;
  Card **ppCVar1;
  undefined8 *in_RDI;
  Card **cards;
  char *cardString;
  
  __ptr = strdup(
                "2d,3d,4d,5d,13d,13h,1s,13s,2s,3s,4s,5s,6s,7s,8s,9s,10s,11s,12s,1c,2c,3c,4c,5c,6c,7c,8c,9c,10c,11c,12c,13c,2h,3h,4h,5h,6h,7h,8h,9h,10h,11h,12h,12d,6d,7d,8d,9d,10d,11d,1h,1d"
                );
  *in_RDI = 0x34;
  ppCVar1 = cards_createFromIds((char *)cardsCount);
  free(__ptr);
  return ppCVar1;
}

Assistant:

Card ** acesup_deckCreateWin(unsigned long * cardsCount)
{
	char * cardString = strdup("2d,3d,4d,5d,13d,13h,1s,13s,2s,3s,4s,5s,6s,7s,8s,9s,10s,11s,12s,1c,2c,3c,4c,5c,6c,7c,8c,9c,10c,11c,12c,13c,2h,3h,4h,5h,6h,7h,8h,9h,10h,11h,12h,12d,6d,7d,8d,9d,10d,11d,1h,1d");
	Card ** cards;
	*cardsCount = 52;
	cards = cards_createFromIds(cardString);
	free(cardString);
	return cards;
}